

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3_xauth p_Var1;
  ulong uVar2;
  Index *pTrigger_00;
  int iVar3;
  sqlite3 *db_00;
  uchar *zDatabase;
  uchar *zSql;
  uchar *zName;
  uchar *zNew_00;
  Table *pTVar4;
  long lVar5;
  SrcItem *pItem;
  u8 *puStack_2b0;
  int i;
  TriggerStep *pStep;
  Trigger *pTrigger;
  FKey *pFKey;
  NameContext sNC;
  Select *pSelect;
  Table *pTab;
  int isLegacy;
  sqlite3_xauth xAuth;
  Walker sWalker;
  RenameCtx sCtx;
  int bQuote;
  int rc;
  Parse sParse;
  int bTemp;
  char *zNew;
  char *zOld;
  char *zInput;
  char *zDb;
  sqlite3 *db;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  db_00 = sqlite3_context_db_handle(context);
  zDatabase = sqlite3_value_text(*argv);
  zSql = sqlite3_value_text(argv[3]);
  zName = sqlite3_value_text(argv[4]);
  zNew_00 = sqlite3_value_text(argv[5]);
  sParse.pRename._4_4_ = sqlite3_value_int(argv[6]);
  if (((zSql != (uchar *)0x0) && (zName != (uchar *)0x0)) && (zNew_00 != (uchar *)0x0)) {
    p_Var1 = db_00->xAuth;
    db_00->xAuth = (sqlite3_xauth)0x0;
    sqlite3BtreeEnterAll(db_00);
    memset(&sWalker.u,0,0x20);
    pTVar4 = sqlite3FindTable(db_00,(char *)zName,(char *)zDatabase);
    memset(&xAuth,0,0x30);
    xAuth = (sqlite3_xauth)&bQuote;
    sWalker.pParse = (Parse *)renameTableExprCb;
    sWalker.xExprCallback = renameTableSelectCb;
    sWalker._32_8_ = &sWalker.u;
    sCtx.zOld._4_4_ =
         renameParseSql((Parse *)&bQuote,(char *)zDatabase,db_00,(char *)zSql,sParse.pRename._4_4_);
    pTrigger_00 = sParse.pNewIndex;
    if (sCtx.zOld._4_4_ == 0) {
      uVar2 = db_00->flags;
      if (sParse.zTail == (char *)0x0) {
        if (sParse.pNewTable == (Table *)0x0) {
          iVar3 = sqlite3_stricmp((char *)(sParse.pNewIndex)->aiColumn,(char *)zName);
          if ((iVar3 == 0) && (pTVar4->pSchema == pTrigger_00->pSchema)) {
            renameTokenFind((Parse *)&bQuote,(RenameCtx *)&sWalker.u,(sParse.pNewIndex)->aiColumn);
          }
          if (((uVar2 & 0x4000000) == 0) &&
             (sCtx.zOld._4_4_ = renameResolveTrigger((Parse *)&bQuote), sCtx.zOld._4_4_ == 0)) {
            renameWalkTrigger((Walker *)&xAuth,(Trigger *)pTrigger_00);
            for (puStack_2b0 = pTrigger_00->aSortOrder; puStack_2b0 != (u8 *)0x0;
                puStack_2b0 = *(u8 **)(puStack_2b0 + 0x50)) {
              if ((*(long *)(puStack_2b0 + 0x18) != 0) &&
                 (iVar3 = sqlite3_stricmp(*(char **)(puStack_2b0 + 0x18),(char *)zName), iVar3 == 0)
                 ) {
                renameTokenFind((Parse *)&bQuote,(RenameCtx *)&sWalker.u,
                                *(void **)(puStack_2b0 + 0x18));
              }
              if (*(long *)(puStack_2b0 + 0x20) != 0) {
                for (pItem._4_4_ = 0; pItem._4_4_ < **(int **)(puStack_2b0 + 0x20);
                    pItem._4_4_ = pItem._4_4_ + 1) {
                  lVar5 = *(long *)(puStack_2b0 + 0x20) + 8 + (long)pItem._4_4_ * 0x68;
                  iVar3 = sqlite3_stricmp(*(char **)(lVar5 + 0x10),(char *)zName);
                  if (iVar3 == 0) {
                    renameTokenFind((Parse *)&bQuote,(RenameCtx *)&sWalker.u,
                                    *(void **)(lVar5 + 0x10));
                  }
                }
              }
            }
          }
        }
        else {
          renameTokenFind((Parse *)&bQuote,(RenameCtx *)&sWalker.u,(sParse.pNewTable)->zName);
          if ((uVar2 & 0x4000000) == 0) {
            sqlite3WalkExpr((Walker *)&xAuth,(Expr *)((sParse.pNewTable)->u).tab.pFKey);
          }
        }
      }
      else if (sParse.zTail[0x3f] == '\x02') {
        if ((uVar2 & 0x4000000) == 0) {
          sNC.pWinSelect = *(Select **)(sParse.zTail + 0x40);
          memset(&pFKey,0,0x38);
          pFKey = (FKey *)&bQuote;
          (sNC.pWinSelect)->selFlags = (sNC.pWinSelect)->selFlags & 0xffdfffff;
          sqlite3SelectPrep((Parse *)&bQuote,*(Select **)(sParse.zTail + 0x40),(NameContext *)&pFKey
                           );
          if (sParse.nRangeReg == 0) {
            sqlite3WalkSelect((Walker *)&xAuth,*(Select **)(sParse.zTail + 0x40));
          }
          else {
            sCtx.zOld._4_4_ = (int)sParse.pVdbe;
          }
        }
      }
      else {
        if ((((uVar2 & 0x4000000) == 0) || ((db_00->flags & 0x4000) != 0)) &&
           (sParse.zTail[0x3f] != '\x01')) {
          for (pTrigger = *(Trigger **)(sParse.zTail + 0x48); pTrigger != (Trigger *)0x0;
              pTrigger = (Trigger *)pTrigger->table) {
            iVar3 = sqlite3_stricmp(*(char **)&pTrigger->op,(char *)zName);
            if (iVar3 == 0) {
              renameTokenFind((Parse *)&bQuote,(RenameCtx *)&sWalker.u,*(void **)&pTrigger->op);
            }
          }
        }
        iVar3 = sqlite3_stricmp((char *)zName,*(char **)sParse.zTail);
        if (iVar3 == 0) {
          if ((uVar2 & 0x4000000) == 0) {
            sqlite3WalkExprList((Walker *)&xAuth,*(ExprList **)(sParse.zTail + 0x20));
          }
          renameTokenFind((Parse *)&bQuote,(RenameCtx *)&sWalker.u,*(void **)sParse.zTail);
        }
      }
    }
    if (sCtx.zOld._4_4_ == 0) {
      sCtx.zOld._4_4_ =
           renameEditSql(context,(RenameCtx *)&sWalker.u,(char *)zSql,(char *)zNew_00,1);
    }
    if (sCtx.zOld._4_4_ != 0) {
      if ((sCtx.zOld._4_4_ == 1) && (iVar3 = sqlite3WritableSchema(db_00), iVar3 != 0)) {
        sqlite3_result_value(context,argv[3]);
      }
      else if (sParse.db == (sqlite3 *)0x0) {
        sqlite3_result_error_code(context,sCtx.zOld._4_4_);
      }
      else {
        renameColumnParseError(context,"",argv[1],argv[2],(Parse *)&bQuote);
      }
    }
    renameParseCleanup((Parse *)&bQuote);
    renameTokenFree(db_00,(RenameToken *)sWalker.u.pNC);
    sqlite3BtreeLeaveAll(db_00);
    db_00->xAuth = p_Var1;
  }
  return;
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zDb = (const char*)sqlite3_value_text(argv[0]);
  const char *zInput = (const char*)sqlite3_value_text(argv[3]);
  const char *zOld = (const char*)sqlite3_value_text(argv[4]);
  const char *zNew = (const char*)sqlite3_value_text(argv[5]);
  int bTemp = sqlite3_value_int(argv[6]);
  UNUSED_PARAMETER(NotUsed);

  if( zInput && zOld && zNew ){
    Parse sParse;
    int rc;
    int bQuote = 1;
    RenameCtx sCtx;
    Walker sWalker;

#ifndef SQLITE_OMIT_AUTHORIZATION
    sqlite3_xauth xAuth = db->xAuth;
    db->xAuth = 0;
#endif

    sqlite3BtreeEnterAll(db);

    memset(&sCtx, 0, sizeof(RenameCtx));
    sCtx.pTab = sqlite3FindTable(db, zOld, zDb);
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = &sParse;
    sWalker.xExprCallback = renameTableExprCb;
    sWalker.xSelectCallback = renameTableSelectCb;
    sWalker.u.pRename = &sCtx;

    rc = renameParseSql(&sParse, zDb, db, zInput, bTemp);

    if( rc==SQLITE_OK ){
      int isLegacy = (db->flags & SQLITE_LegacyAlter);
      if( sParse.pNewTable ){
        Table *pTab = sParse.pNewTable;

        if( IsView(pTab) ){
          if( isLegacy==0 ){
            Select *pSelect = pTab->u.view.pSelect;
            NameContext sNC;
            memset(&sNC, 0, sizeof(sNC));
            sNC.pParse = &sParse;

            assert( pSelect->selFlags & SF_View );
            pSelect->selFlags &= ~SF_View;
            sqlite3SelectPrep(&sParse, pTab->u.view.pSelect, &sNC);
            if( sParse.nErr ){
              rc = sParse.rc;
            }else{
              sqlite3WalkSelect(&sWalker, pTab->u.view.pSelect);
            }
          }
        }else{
          /* Modify any FK definitions to point to the new table. */
#ifndef SQLITE_OMIT_FOREIGN_KEY
          if( (isLegacy==0 || (db->flags & SQLITE_ForeignKeys))
           && !IsVirtual(pTab)
          ){
            FKey *pFKey;
            assert( IsOrdinaryTable(pTab) );
            for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
              if( sqlite3_stricmp(pFKey->zTo, zOld)==0 ){
                renameTokenFind(&sParse, &sCtx, (void*)pFKey->zTo);
              }
            }
          }
#endif

          /* If this is the table being altered, fix any table refs in CHECK
          ** expressions. Also update the name that appears right after the
          ** "CREATE [VIRTUAL] TABLE" bit. */
          if( sqlite3_stricmp(zOld, pTab->zName)==0 ){
            sCtx.pTab = pTab;
            if( isLegacy==0 ){
              sqlite3WalkExprList(&sWalker, pTab->pCheck);
            }
            renameTokenFind(&sParse, &sCtx, pTab->zName);
          }
        }
      }

      else if( sParse.pNewIndex ){
        renameTokenFind(&sParse, &sCtx, sParse.pNewIndex->zName);
        if( isLegacy==0 ){
          sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
        }
      }

#ifndef SQLITE_OMIT_TRIGGER
      else{
        Trigger *pTrigger = sParse.pNewTrigger;
        TriggerStep *pStep;
        if( 0==sqlite3_stricmp(sParse.pNewTrigger->table, zOld)
            && sCtx.pTab->pSchema==pTrigger->pTabSchema
          ){
          renameTokenFind(&sParse, &sCtx, sParse.pNewTrigger->table);
        }

        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse);
          if( rc==SQLITE_OK ){
            renameWalkTrigger(&sWalker, pTrigger);
            for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
              if( pStep->zTarget && 0==sqlite3_stricmp(pStep->zTarget, zOld) ){
                renameTokenFind(&sParse, &sCtx, pStep->zTarget);
              }
              if( pStep->pFrom ){
                int i;
                for(i=0; i<pStep->pFrom->nSrc; i++){
                  SrcItem *pItem = &pStep->pFrom->a[i];
                  if( 0==sqlite3_stricmp(pItem->zName, zOld) ){
                    renameTokenFind(&sParse, &sCtx, pItem->zName);
                  }
                }
              }
            }
          }
        }
      }
#endif
    }

    if( rc==SQLITE_OK ){
      rc = renameEditSql(context, &sCtx, zInput, zNew, bQuote);
    }
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_ERROR && sqlite3WritableSchema(db) ){
        sqlite3_result_value(context, argv[3]);
      }else if( sParse.zErrMsg ){
        renameColumnParseError(context, "", argv[1], argv[2], &sParse);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }

    renameParseCleanup(&sParse);
    renameTokenFree(db, sCtx.pList);
    sqlite3BtreeLeaveAll(db);
#ifndef SQLITE_OMIT_AUTHORIZATION
    db->xAuth = xAuth;
#endif
  }

  return;
}